

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyMemBackendPoolFree(SyMemBackend *pBackend,void *pChunk)

{
  sxi32 sVar1;
  sxi32 rc;
  void *pChunk_local;
  SyMemBackend *pBackend_local;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  sVar1 = MemBackendPoolFree(pBackend,pChunk);
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendPoolFree(SyMemBackend *pBackend, void * pChunk)
{
	sxi32 rc;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) || pChunk == 0 ){
		return SXERR_CORRUPT;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	rc = MemBackendPoolFree(&(*pBackend), pChunk);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return rc;
}